

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sticky.cpp
# Opt level: O1

void __thiscall OpenMD::Sticky::calcForce(Sticky *this,InteractionData *idat)

{
  RealType *t;
  char cVar1;
  pointer piVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  undefined1 auVar5 [16];
  uint i_5;
  RotMat3x3d *pRVar6;
  long lVar7;
  double *pdVar8;
  uint i_2;
  long lVar9;
  uint i;
  long lVar10;
  RotMat3x3d *pRVar11;
  double *pdVar12;
  uint j;
  long lVar13;
  uint j_1;
  byte bVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  Vector<double,_3U> result_6;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_7;
  Vector<double,_3U> result_18;
  Vector<double,_3U> result_17;
  RealType dspdr;
  RealType sp;
  RealType dsdr;
  RealType s;
  Vector<double,_3U> result_4;
  Vector<double,_3U> result_22;
  Vector<double,_3U> result_36;
  Vector<double,_3U> result_35;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result_37;
  Vector<double,_3U> result_34;
  Vector<double,_3U> result_30;
  RotMat3x3d A2trans;
  RotMat3x3d A1trans;
  double local_438 [4];
  double local_418 [4];
  double local_3f8 [4];
  double local_3d8 [4];
  double local_3b8 [4];
  RealType local_398;
  RealType local_390;
  undefined1 local_388 [16];
  RealType local_378;
  RealType local_370;
  double local_368 [4];
  undefined1 local_348 [16];
  double local_338;
  double dStack_330;
  double local_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  undefined1 local_308 [16];
  double local_2f8;
  double local_2e8;
  double local_2e0;
  double local_2d8 [4];
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  undefined8 uStack_290;
  double local_288;
  undefined8 uStack_280;
  double local_278;
  undefined8 uStack_270;
  double local_268 [4];
  double local_248 [4];
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined1 local_1e8 [16];
  double local_1d8;
  undefined1 local_1c8 [16];
  double local_1b8;
  undefined1 local_1a8 [16];
  double local_198;
  double local_188 [10];
  double local_138 [4];
  double local_118 [4];
  double local_f8 [4];
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8 [10];
  double local_68 [9];
  
  bVar14 = 0;
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar2 = (this->Stids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar2[idat->atid1]].
                    super__Vector_base<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar9 = (long)piVar2[idat->atid2] * 0x58;
  dVar20 = idat->rij;
  if (dVar20 <= *(double *)(lVar7 + 0x20 + lVar9)) {
    local_d8 = *(double *)(lVar7 + 0x28 + lVar9);
    uStack_d0 = 0;
    local_2e0 = *(double *)(lVar7 + 0x30 + lVar9);
    local_2e8 = *(double *)(lVar7 + 0x38 + lVar9);
    dVar17 = *(double *)(lVar7 + lVar9);
    dVar15 = *(double *)(lVar7 + 8 + lVar9);
    local_298 = *(double *)(lVar7 + 0x10 + lVar9);
    local_2a8 = *(double *)(lVar7 + 0x18 + lVar9);
    cVar1 = *(char *)(lVar7 + 0x50 + lVar9);
    t = &idat->rij;
    local_338 = idat->r2;
    local_278 = dVar20 * local_338;
    pRVar6 = &idat->A1;
    pdVar8 = local_68;
    local_68[6] = 0.0;
    local_68[7] = 0.0;
    local_68[4] = 0.0;
    local_68[5] = 0.0;
    local_68[2] = 0.0;
    local_68[3] = 0.0;
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_68[8] = 0.0;
    lVar10 = 0;
    pRVar11 = pRVar6;
    do {
      lVar13 = 0;
      pdVar12 = pdVar8;
      do {
        *pdVar12 = (pRVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                   [0][lVar13];
        lVar13 = lVar13 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar13 != 3);
      lVar10 = lVar10 + 1;
      pdVar8 = pdVar8 + 1;
      pRVar11 = (RotMat3x3d *)
                ((pRVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                );
    } while (lVar10 != 3);
    pdVar8 = local_b8;
    local_b8[6] = 0.0;
    local_b8[7] = 0.0;
    local_b8[4] = 0.0;
    local_b8[5] = 0.0;
    local_b8[2] = 0.0;
    local_b8[3] = 0.0;
    local_b8[0] = 0.0;
    local_b8[1] = 0.0;
    local_b8[8] = 0.0;
    lVar10 = 0;
    pRVar11 = &idat->A2;
    do {
      lVar13 = 0;
      pdVar12 = pdVar8;
      do {
        *pdVar12 = (pRVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                   [0][lVar13];
        lVar13 = lVar13 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar13 != 3);
      lVar10 = lVar10 + 1;
      pdVar8 = pdVar8 + 1;
      pRVar11 = (RotMat3x3d *)
                ((pRVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                );
    } while (lVar10 != 3);
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar10 = 0;
    do {
      dVar21 = local_188[lVar10];
      lVar13 = 0;
      do {
        dVar21 = dVar21 + (pRVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar13] * (idat->d).super_Vector<double,_3U>.data_[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      local_188[lVar10] = dVar21;
      local_288 = local_188[2];
      local_348._0_8_ = local_188[1];
      local_388._0_8_ = local_188[0];
      lVar10 = lVar10 + 1;
      pRVar6 = (RotMat3x3d *)
               ((pRVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar10 != 3);
    pdVar8 = local_188;
    pRVar6 = &idat->A2;
    pdVar12 = pdVar8;
    for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
      *pdVar12 = (pRVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                 [0];
      pRVar6 = (RotMat3x3d *)((long)pRVar6 + (ulong)bVar14 * -0x10 + 8);
      pdVar12 = pdVar12 + (ulong)bVar14 * -2 + 1;
    }
    lVar10 = 0;
    do {
      lVar13 = 0;
      do {
        pdVar8[lVar13] = -pdVar8[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      lVar10 = lVar10 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar10 != 3);
    local_368[0] = 0.0;
    local_368[1] = 0.0;
    local_368[2] = 0.0;
    pdVar8 = local_188;
    lVar10 = 0;
    do {
      dVar21 = local_368[lVar10];
      lVar13 = 0;
      do {
        dVar21 = dVar21 + pdVar8[lVar13] * (idat->d).super_Vector<double,_3U>.data_[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      local_368[lVar10] = dVar21;
      lVar10 = lVar10 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar10 != 3);
    local_318 = local_368[2];
    dStack_310 = 0.0;
    local_c8 = local_368[0];
    dStack_c0 = local_368[1];
    local_370 = 0.0;
    local_378 = 0.0;
    local_390 = 0.0;
    local_398 = 0.0;
    uStack_270 = 0;
    uStack_280 = 0;
    local_348._8_8_ = local_368[1];
    dStack_330 = (double)0;
    local_388._8_8_ = local_348._0_8_;
    local_328 = (double)local_388._0_8_;
    dStack_320 = local_368[0];
    if (dVar20 < dVar15) {
      if (dVar17 <= dVar20) {
        dStack_330 = 0.0;
        CubicSpline::getValueAndDerivativeAt
                  (*(CubicSpline **)(lVar7 + lVar9 + 0x40),t,&local_370,&local_378);
      }
      else {
        local_370 = 1.0;
        local_378 = 0.0;
        dStack_330 = (double)0;
      }
    }
    local_338 = local_338 * local_278;
    local_2b8 = local_288 * local_288;
    local_328 = local_328 * local_328;
    dStack_320 = dStack_320 * dStack_320;
    local_348._0_8_ = (double)local_348._0_8_ * (double)local_348._0_8_;
    local_348._8_8_ = (double)local_348._8_8_ * (double)local_348._8_8_;
    dVar15 = local_318 * local_318;
    uStack_290 = dStack_310;
    bVar4 = *t < local_2a8;
    dVar20 = (double)local_388._0_8_;
    dVar17 = (double)local_388._8_8_;
    local_2a8 = (double)local_388._8_8_;
    dStack_2a0 = (double)local_388._0_8_;
    if (bVar4) {
      if (local_298 <= *t) {
        dStack_2b0 = (double)uStack_280;
        local_298 = dVar15;
        CubicSpline::getValueAndDerivativeAt
                  (*(CubicSpline **)(lVar7 + lVar9 + 0x48),t,&local_390,&local_398);
        dVar20 = (double)local_388._0_8_;
        dVar17 = (double)local_388._8_8_;
        dVar15 = local_298;
      }
      else {
        local_390 = 1.0;
        local_398 = 0.0;
      }
    }
    local_298 = dVar15;
    dStack_330 = local_328 - (double)local_348._0_8_;
    local_328 = dStack_320 - (double)local_348._8_8_;
    auVar31._0_8_ = dVar20 * 4.0 * local_288;
    auVar31._8_8_ = dVar17 * -4.0 * local_288;
    auVar3._8_8_ = local_278;
    auVar3._0_8_ = local_278;
    auVar32 = divpd(auVar31,auVar3);
    auVar24._0_8_ = dVar20 * 6.0 * local_288 * dStack_330;
    auVar24._8_8_ = dVar17 * 6.0 * local_288 * dStack_330;
    auVar25._8_8_ = local_338;
    auVar25._0_8_ = local_338;
    auVar25 = divpd(auVar24,auVar25);
    dVar15 = *t;
    local_188[0] = auVar32._0_8_ - auVar25._0_8_;
    local_188[1] = auVar32._8_8_ - auVar25._8_8_;
    local_188[2] = (dStack_330 + dStack_330) / local_278 -
                   (local_2b8 * 6.0 * dStack_330) / local_338;
    auVar18._8_8_ = local_318;
    auVar18._0_8_ = local_288;
    local_388._8_8_ = local_318 * (local_328 + local_328);
    local_388._0_8_ = local_288 * (dStack_330 + dStack_330);
    auVar28._0_8_ = local_c8 * 6.0 * local_318 * local_328;
    auVar28._8_8_ = dStack_c0 * 6.0 * local_318 * local_328;
    auVar32._8_8_ = local_338;
    auVar32._0_8_ = local_338;
    auVar32 = divpd(auVar28,auVar32);
    auVar22._0_8_ = local_c8 * 4.0 * local_318;
    auVar22._8_8_ = dStack_c0 * -4.0 * local_318;
    auVar5._8_8_ = local_278;
    auVar5._0_8_ = local_278;
    auVar25 = divpd(auVar22,auVar5);
    local_368[0] = auVar25._0_8_ - auVar32._0_8_;
    local_368[1] = auVar25._8_8_ - auVar32._8_8_;
    local_368[2] = (local_328 + local_328) / local_278 - (local_298 * 6.0 * local_328) / local_338;
    local_348._8_8_ = dVar15;
    local_348._0_8_ = dVar15;
    auVar25 = divpd(auVar18,local_348);
    dVar29 = auVar25._0_8_ + -0.6;
    dVar30 = auVar25._8_8_ + -0.6;
    dVar21 = auVar25._0_8_ + 0.8;
    dVar19 = auVar25._8_8_ + 0.8;
    dVar27 = dVar29 * dVar29 * dVar21 + dVar29 * dVar21 * dVar21;
    dVar23 = dVar30 * dVar30 * dVar19 + dVar30 * dVar19 * dVar19;
    dVar34 = 1.0 / dVar15 - local_2b8 / local_278;
    auVar26._0_8_ = local_288 * dVar20 * -2.0 * dVar27;
    auVar26._8_8_ = local_288 * dVar17 * -2.0 * dVar27;
    local_1a8 = divpd(auVar26,auVar5);
    local_198 = (dVar34 + dVar34) * dVar27;
    dVar15 = 1.0 / dVar15 - local_298 / local_278;
    auVar33._0_8_ = local_318 * local_c8 * -2.0 * dVar23;
    auVar33._8_8_ = local_318 * dStack_c0 * -2.0 * dVar23;
    local_1c8 = divpd(auVar33,auVar5);
    local_1b8 = (dVar15 + dVar15) * dVar23;
    auVar36._0_8_ = (local_2b8 * local_2a8 + local_2a8 * 0.5 * dStack_330) * 4.0;
    auVar36._8_8_ = (local_2b8 * dStack_2a0 + dStack_2a0 * -0.5 * dStack_330) * 4.0;
    local_308 = divpd(auVar36,auVar5);
    local_2f8 = (dVar20 * -8.0 * dVar17 * local_288) / local_278;
    auVar16._0_8_ = (local_298 * dStack_c0 + dStack_c0 * 0.5 * local_328) * 4.0;
    auVar16._8_8_ = (local_298 * local_c8 + local_c8 * -0.5 * local_328) * 4.0;
    local_388 = divpd(local_388,auVar5);
    local_1e8 = divpd(auVar16,auVar5);
    local_1d8 = (local_c8 * -8.0 * dStack_c0 * local_318) / local_278;
    auVar37._0_8_ = (dVar17 + dVar17) * dVar27;
    auVar37._8_8_ = dVar20 * -2.0 * dVar27;
    local_208 = divpd(auVar37,local_348);
    auVar35._0_8_ = (dStack_c0 + dStack_c0) * dVar23;
    auVar35._8_8_ = local_c8 * -2.0 * dVar23;
    local_228 = divpd(auVar35,local_348);
    local_318 = local_388._8_8_;
    local_1f8 = 0;
    local_218 = 0;
    if (cVar1 == '\0') {
      local_318 = local_388._0_8_ + local_318;
      dVar20 = (dVar30 * dVar30 * dVar19 * dVar19 - local_d8) +
               (dVar29 * dVar29 * dVar21 * dVar21 - local_d8);
    }
    else {
      local_338 = dStack_330;
      dStack_320 = local_328;
      dStack_310 = local_318;
      local_2b8 = local_278;
      dStack_2b0 = local_278;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"This is probably an error!\n",0x1b);
      dVar20 = (double)local_388._0_8_ * (double)local_388._0_8_ * 0.75;
      local_418[0] = 0.0;
      local_418[1] = 0.0;
      local_418[2] = 0.0;
      lVar7 = 0;
      do {
        local_418[lVar7] = local_188[lVar7] * dVar20;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_438[0] = 0.0;
      local_438[1] = 0.0;
      local_438[2] = 0.0;
      lVar7 = 0;
      do {
        local_438[lVar7] = local_188[lVar7] * 0.75;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_3f8[0] = 0.0;
      local_3f8[1] = 0.0;
      local_3f8[2] = 0.0;
      lVar7 = 0;
      do {
        local_3f8[lVar7] = local_418[lVar7] + local_438[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_188[2] = local_3f8[2];
      local_188[0] = local_3f8[0];
      local_188[1] = local_3f8[1];
      dVar17 = local_318 * local_318 * 0.75;
      local_418[0] = 0.0;
      local_418[1] = 0.0;
      local_418[2] = 0.0;
      lVar7 = 0;
      do {
        local_418[lVar7] = local_188[lVar7] * dVar17;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_438[0] = 0.0;
      local_438[1] = 0.0;
      local_438[2] = 0.0;
      lVar7 = 0;
      do {
        local_438[lVar7] = local_188[lVar7] * 0.75;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_3f8[0] = 0.0;
      local_3f8[1] = 0.0;
      local_3f8[2] = 0.0;
      lVar7 = 0;
      do {
        local_3f8[lVar7] = local_418[lVar7] + local_438[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_368[2] = local_3f8[2];
      local_368[0] = local_3f8[0];
      local_368[1] = local_3f8[1];
      local_1a8._8_8_ = OpenMD::V3Zero._8_8_;
      local_1a8._0_8_ = OpenMD::V3Zero._0_8_;
      local_198 = (double)OpenMD::V3Zero._16_8_;
      local_1c8._8_8_ = OpenMD::V3Zero._8_8_;
      local_1c8._0_8_ = OpenMD::V3Zero._0_8_;
      local_1b8 = (double)OpenMD::V3Zero._16_8_;
      local_418[0] = 0.0;
      local_418[1] = 0.0;
      local_418[2] = 0.0;
      lVar7 = 0;
      do {
        local_418[lVar7] = *(double *)(local_308 + lVar7 * 8) * dVar20;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_438[0] = 0.0;
      local_438[1] = 0.0;
      local_438[2] = 0.0;
      lVar7 = 0;
      do {
        local_438[lVar7] = *(double *)(local_308 + lVar7 * 8) * 0.75;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_3f8[0] = 0.0;
      local_3f8[1] = 0.0;
      local_3f8[2] = 0.0;
      lVar7 = 0;
      do {
        local_3f8[lVar7] = local_418[lVar7] + local_438[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_2f8 = local_3f8[2];
      local_308._8_8_ = local_3f8[1];
      local_308._0_8_ = local_3f8[0];
      local_418[0] = 0.0;
      local_418[1] = 0.0;
      local_418[2] = 0.0;
      lVar7 = 0;
      do {
        local_418[lVar7] = *(double *)(local_1e8 + lVar7 * 8) * dVar17;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_438[0] = 0.0;
      local_438[1] = 0.0;
      local_438[2] = 0.0;
      lVar7 = 0;
      do {
        local_438[lVar7] = *(double *)(local_1e8 + lVar7 * 8) * 0.75;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_3f8[0] = 0.0;
      local_3f8[1] = 0.0;
      local_3f8[2] = 0.0;
      lVar7 = 0;
      do {
        local_3f8[lVar7] = local_418[lVar7] + local_438[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_2f8 = local_3f8[2];
      local_308._8_8_ = local_3f8[1];
      local_308._0_8_ = local_3f8[0];
      local_208._8_8_ = OpenMD::V3Zero._8_8_;
      local_208._0_8_ = OpenMD::V3Zero._0_8_;
      local_1f8 = OpenMD::V3Zero._16_8_;
      local_228._8_8_ = OpenMD::V3Zero._8_8_;
      local_228._0_8_ = OpenMD::V3Zero._0_8_;
      local_218 = OpenMD::V3Zero._16_8_;
      local_318 = local_318 * 0.75 +
                  local_318 * 0.25 * local_318 * local_318 +
                  (double)local_388._0_8_ * 0.25 * (double)local_388._0_8_ * (double)local_388._0_8_
                  + (double)local_388._0_8_ * 0.75 + local_2e8;
      local_390 = 0.0;
      local_398 = 0.0;
      dVar20 = 0.0;
    }
    dVar21 = local_370 * local_2e0;
    dVar15 = local_390 * local_2e8;
    dVar19 = (dVar21 * local_318 + dVar20 * dVar15) * 0.5;
    idat->vpair = idat->vpair + dVar19;
    dVar17 = idat->sw;
    dVar19 = dVar19 * dVar17;
    (idat->pot).data_[5] = (idat->pot).data_[5] + dVar19;
    if (idat->isSelected == true) {
      (idat->selePot).data_[5] = dVar19 + (idat->selePot).data_[5];
    }
    local_3b8[0] = 0.0;
    local_3b8[1] = 0.0;
    local_3b8[2] = 0.0;
    lVar7 = 0;
    do {
      local_3b8[lVar7] = *(double *)(local_308 + lVar7 * 8) * dVar21;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_3d8[0] = 0.0;
    local_3d8[1] = 0.0;
    local_3d8[2] = 0.0;
    lVar7 = 0;
    do {
      local_3d8[lVar7] = *(double *)(local_208 + lVar7 * 8) * dVar15;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_438[0] = 0.0;
    local_438[1] = 0.0;
    local_438[2] = 0.0;
    lVar7 = 0;
    do {
      local_438[lVar7] = local_3b8[lVar7] + local_3d8[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_418[0] = 0.0;
    local_418[1] = 0.0;
    local_418[2] = 0.0;
    lVar7 = 0;
    do {
      local_418[lVar7] = local_438[lVar7] * dVar17 * 0.5;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_3f8[2] = local_418[2];
    local_3f8[0] = local_418[0];
    local_3f8[1] = local_418[1];
    local_3d8[0] = 0.0;
    local_3d8[1] = 0.0;
    local_3d8[2] = 0.0;
    lVar7 = 0;
    do {
      local_3d8[lVar7] = *(double *)(local_1e8 + lVar7 * 8) * dVar21;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_2d8[0] = 0.0;
    local_2d8[1] = 0.0;
    local_2d8[2] = 0.0;
    lVar7 = 0;
    do {
      local_2d8[lVar7] = *(double *)(local_228 + lVar7 * 8) * dVar15;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_3b8[0] = 0.0;
    local_3b8[1] = 0.0;
    local_3b8[2] = 0.0;
    lVar7 = 0;
    do {
      local_3b8[lVar7] = local_3d8[lVar7] + local_2d8[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_438[0] = 0.0;
    local_438[1] = 0.0;
    local_438[2] = 0.0;
    lVar7 = 0;
    do {
      local_438[lVar7] = local_3b8[lVar7] * dVar17 * 0.5;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_418[2] = local_438[2];
    local_418[0] = local_438[0];
    local_418[1] = local_438[1];
    local_438[0] = 0.0;
    local_438[1] = 0.0;
    local_438[2] = 0.0;
    pdVar8 = local_68;
    lVar7 = 0;
    do {
      dVar19 = local_438[lVar7];
      lVar9 = 0;
      do {
        dVar19 = dVar19 + pdVar8[lVar9] * local_3f8[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      local_438[lVar7] = dVar19;
      lVar7 = lVar7 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar7 != 3);
    lVar7 = 0;
    do {
      (idat->t1).super_Vector<double,_3U>.data_[lVar7] =
           local_438[lVar7] + (idat->t1).super_Vector<double,_3U>.data_[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_438[0] = 0.0;
    local_438[1] = 0.0;
    local_438[2] = 0.0;
    pdVar8 = local_b8;
    lVar7 = 0;
    do {
      dVar19 = local_438[lVar7];
      lVar9 = 0;
      do {
        dVar19 = dVar19 + pdVar8[lVar9] * local_418[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      local_438[lVar7] = dVar19;
      lVar7 = lVar7 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar7 != 3);
    lVar7 = 0;
    do {
      (idat->t2).super_Vector<double,_3U>.data_[lVar7] =
           local_438[lVar7] + (idat->t2).super_Vector<double,_3U>.data_[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_3b8[0] = 0.0;
    local_3b8[1] = 0.0;
    local_3b8[2] = 0.0;
    lVar7 = 0;
    do {
      local_3b8[lVar7] = local_188[lVar7] * dVar21;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_3d8[0] = 0.0;
    local_3d8[1] = 0.0;
    local_3d8[2] = 0.0;
    lVar7 = 0;
    do {
      local_3d8[lVar7] = *(double *)(local_1a8 + lVar7 * 8) * dVar15;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_438[0] = 0.0;
    local_438[1] = 0.0;
    local_438[2] = 0.0;
    lVar7 = 0;
    do {
      local_438[lVar7] = local_3b8[lVar7] + local_3d8[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_f8[0] = 0.0;
    local_f8[1] = 0.0;
    local_f8[2] = 0.0;
    lVar7 = 0;
    do {
      local_f8[lVar7] = local_438[lVar7] * dVar17;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_3b8[0] = 0.0;
    local_3b8[1] = 0.0;
    local_3b8[2] = 0.0;
    lVar7 = 0;
    do {
      local_3b8[lVar7] = local_368[lVar7] * dVar21;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_3d8[0] = 0.0;
    local_3d8[1] = 0.0;
    local_3d8[2] = 0.0;
    lVar7 = 0;
    do {
      local_3d8[lVar7] = *(double *)(local_1c8 + lVar7 * 8) * dVar15;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_438[0] = 0.0;
    local_438[1] = 0.0;
    local_438[2] = 0.0;
    lVar7 = 0;
    do {
      local_438[lVar7] = local_3b8[lVar7] + local_3d8[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    dVar17 = idat->sw;
    local_118[0] = 0.0;
    local_118[1] = 0.0;
    local_118[2] = 0.0;
    lVar7 = 0;
    do {
      local_118[lVar7] = local_438[lVar7] * dVar17;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_248[0] = 0.0;
    local_248[1] = 0.0;
    local_248[2] = 0.0;
    pdVar8 = local_68;
    lVar7 = 0;
    do {
      dVar17 = local_248[lVar7];
      lVar9 = 0;
      do {
        dVar17 = dVar17 + pdVar8[lVar9] * local_f8[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      local_248[lVar7] = dVar17;
      lVar7 = lVar7 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar7 != 3);
    local_268[0] = 0.0;
    local_268[1] = 0.0;
    local_268[2] = 0.0;
    pdVar8 = local_b8;
    lVar7 = 0;
    do {
      dVar17 = local_268[lVar7];
      lVar9 = 0;
      do {
        dVar17 = dVar17 + pdVar8[lVar9] * local_118[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      local_268[lVar7] = dVar17;
      lVar7 = lVar7 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar7 != 3);
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar7 = 0;
    do {
      local_138[lVar7] =
           (idat->d).super_Vector<double,_3U>.data_[lVar7] *
           (local_2e0 * local_378 * local_318 + dVar20 * local_2e8 * local_398);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    dVar20 = *t;
    local_2d8[0] = 0.0;
    local_2d8[1] = 0.0;
    local_2d8[2] = 0.0;
    lVar7 = 0;
    do {
      local_2d8[lVar7] = local_138[lVar7] / dVar20;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_3d8[0] = 0.0;
    local_3d8[1] = 0.0;
    local_3d8[2] = 0.0;
    lVar7 = 0;
    do {
      local_3d8[lVar7] = local_2d8[lVar7] + local_248[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_3b8[0] = 0.0;
    local_3b8[1] = 0.0;
    local_3b8[2] = 0.0;
    lVar7 = 0;
    do {
      local_3b8[lVar7] = local_3d8[lVar7] - local_268[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_438[0] = 0.0;
    local_438[1] = 0.0;
    local_438[2] = 0.0;
    lVar7 = 0;
    do {
      local_438[lVar7] = local_3b8[lVar7] * 0.5;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar7 = 0;
    do {
      (idat->f1).super_Vector<double,_3U>.data_[lVar7] =
           local_438[lVar7] + (idat->f1).super_Vector<double,_3U>.data_[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
  }
  return;
}

Assistant:

void Sticky::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    StickyInteractionData& mixer =
        MixingMap[Stids[idat.atid1]][Stids[idat.atid2]];

    RealType w0   = mixer.w0;
    RealType v0   = mixer.v0;
    RealType v0p  = mixer.v0p;
    RealType rl   = mixer.rl;
    RealType ru   = mixer.ru;
    RealType rlp  = mixer.rlp;
    RealType rup  = mixer.rup;
    RealType rbig = mixer.rbig;
    bool isPower  = mixer.isPower;

    if (idat.rij <= rbig) {
      RealType r3 = idat.r2 * idat.rij;
      RealType r5 = r3 * idat.r2;

      RotMat3x3d A1trans = idat.A1.transpose();
      RotMat3x3d A2trans = idat.A2.transpose();

      // rotate the inter-particle separation into the two different
      // body-fixed coordinate systems:

      Vector3d ri = idat.A1 * idat.d;

      // negative sign because this is the vector from j to i:

      Vector3d rj = -idat.A2 * idat.d;

      RealType xi = ri.x();
      RealType yi = ri.y();
      RealType zi = ri.z();

      RealType xj = rj.x();
      RealType yj = rj.y();
      RealType zj = rj.z();

      RealType xi2 = xi * xi;
      RealType yi2 = yi * yi;
      RealType zi2 = zi * zi;

      RealType xj2 = xj * xj;
      RealType yj2 = yj * yj;
      RealType zj2 = zj * zj;

      // calculate the switching info. from the splines

      RealType s     = 0.0;
      RealType dsdr  = 0.0;
      RealType sp    = 0.0;
      RealType dspdr = 0.0;

      if (idat.rij < ru) {
        if (idat.rij < rl) {
          s    = 1.0;
          dsdr = 0.0;
        } else {
          // we are in the switching region
          mixer.s->getValueAndDerivativeAt(idat.rij, s, dsdr);
        }
      }

      if (idat.rij < rup) {
        if (idat.rij < rlp) {
          sp    = 1.0;
          dspdr = 0.0;
        } else {
          // we are in the switching region
          mixer.sp->getValueAndDerivativeAt(idat.rij, sp, dspdr);
        }
      }

      RealType wi = 2.0 * (xi2 - yi2) * zi / r3;
      RealType wj = 2.0 * (xj2 - yj2) * zj / r3;
      RealType w  = wi + wj;

      RealType zif = zi / idat.rij - 0.6;
      RealType zis = zi / idat.rij + 0.8;

      RealType zjf = zj / idat.rij - 0.6;
      RealType zjs = zj / idat.rij + 0.8;

      RealType wip = zif * zif * zis * zis - w0;
      RealType wjp = zjf * zjf * zjs * zjs - w0;
      RealType wp  = wip + wjp;

      Vector3d dwi(4.0 * xi * zi / r3 - 6.0 * xi * zi * (xi2 - yi2) / r5,
                   -4.0 * yi * zi / r3 - 6.0 * yi * zi * (xi2 - yi2) / r5,
                   2.0 * (xi2 - yi2) / r3 - 6.0 * zi2 * (xi2 - yi2) / r5);

      Vector3d dwj(4.0 * xj * zj / r3 - 6.0 * xj * zj * (xj2 - yj2) / r5,
                   -4.0 * yj * zj / r3 - 6.0 * yj * zj * (xj2 - yj2) / r5,
                   2.0 * (xj2 - yj2) / r3 - 6.0 * zj2 * (xj2 - yj2) / r5);

      RealType uglyi = zif * zif * zis + zif * zis * zis;
      RealType uglyj = zjf * zjf * zjs + zjf * zjs * zjs;

      Vector3d dwip(-2.0 * xi * zi * uglyi / r3, -2.0 * yi * zi * uglyi / r3,
                    2.0 * (1.0 / idat.rij - zi2 / r3) * uglyi);

      Vector3d dwjp(-2.0 * xj * zj * uglyj / r3, -2.0 * yj * zj * uglyj / r3,
                    2.0 * (1.0 / idat.rij - zj2 / r3) * uglyj);

      Vector3d dwidu(4.0 * (yi * zi2 + 0.5 * yi * (xi2 - yi2)) / r3,
                     4.0 * (xi * zi2 - 0.5 * xi * (xi2 - yi2)) / r3,
                     -8.0 * xi * yi * zi / r3);

      Vector3d dwjdu(4.0 * (yj * zj2 + 0.5 * yj * (xj2 - yj2)) / r3,
                     4.0 * (xj * zj2 - 0.5 * xj * (xj2 - yj2)) / r3,
                     -8.0 * xj * yj * zj / r3);

      Vector3d dwipdu(2.0 * yi * uglyi / idat.rij, -2.0 * xi * uglyi / idat.rij,
                      0.0);

      Vector3d dwjpdu(2.0 * yj * uglyj / idat.rij, -2.0 * xj * uglyj / idat.rij,
                      0.0);

      if (isPower) {
        cerr << "This is probably an error!\n";
        RealType frac1 = 0.25;
        RealType frac2 = 0.75;
        RealType wi2   = wi * wi;
        RealType wj2   = wj * wj;
        // sticky power has no w' function:
        w = frac1 * wi * wi2 + frac2 * wi + frac1 * wj * wj2 + frac2 * wj + v0p;
        wp     = 0.0;
        dwi    = frac1 * RealType(3.0) * wi2 * dwi + frac2 * dwi;
        dwj    = frac1 * RealType(3.0) * wj2 * dwi + frac2 * dwi;
        dwip   = V3Zero;
        dwjp   = V3Zero;
        dwidu  = frac1 * RealType(3.0) * wi2 * dwidu + frac2 * dwidu;
        dwidu  = frac1 * RealType(3.0) * wj2 * dwjdu + frac2 * dwjdu;
        dwipdu = V3Zero;
        dwjpdu = V3Zero;
        sp     = 0.0;
        dspdr  = 0.0;
      }

      idat.vpair += 0.5 * (v0 * s * w + v0p * sp * wp);
      idat.pot[HYDROGENBONDING_FAMILY] +=
          0.5 * (v0 * s * w + v0p * sp * wp) * idat.sw;
      if (idat.isSelected)
        idat.selePot[HYDROGENBONDING_FAMILY] +=
            0.5 * (v0 * s * w + v0p * sp * wp) * idat.sw;

      // do the torques first since they are easy:
      // remember that these are still in the body-fixed axes

      Vector3d ti = 0.5 * idat.sw * (v0 * s * dwidu + v0p * sp * dwipdu);
      Vector3d tj = 0.5 * idat.sw * (v0 * s * dwjdu + v0p * sp * dwjpdu);

      // go back to lab frame using transpose of rotation matrix:

      idat.t1 += A1trans * ti;
      idat.t2 += A2trans * tj;

      // Now, on to the forces:

      // first rotate the i terms back into the lab frame:

      Vector3d radcomi = (v0 * s * dwi + v0p * sp * dwip) * idat.sw;
      Vector3d radcomj = (v0 * s * dwj + v0p * sp * dwjp) * idat.sw;

      Vector3d fii = A1trans * radcomi;
      Vector3d fjj = A2trans * radcomj;

      // now assemble these with the radial-only terms:

      idat.f1 += 0.5 * ((v0 * dsdr * w + v0p * dspdr * wp) * idat.d / idat.rij +
                        fii - fjj);
    }

    return;
  }